

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trackableobject.h
# Opt level: O3

void __thiscall
Trackableobject::Trackableobject(Trackableobject *this,int _objectID,centroid c,rect *r)

{
  pair<centroid,_rect> local_48;
  
  (this->locations).c.
  super__Deque_base<std::pair<centroid,_rect>,_std::allocator<std::pair<centroid,_rect>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->locations).c.
  super__Deque_base<std::pair<centroid,_rect>,_std::allocator<std::pair<centroid,_rect>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->locations).c.
  super__Deque_base<std::pair<centroid,_rect>,_std::allocator<std::pair<centroid,_rect>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->locations).c.
  super__Deque_base<std::pair<centroid,_rect>,_std::allocator<std::pair<centroid,_rect>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->locations).c.
  super__Deque_base<std::pair<centroid,_rect>,_std::allocator<std::pair<centroid,_rect>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->locations).c.
  super__Deque_base<std::pair<centroid,_rect>,_std::allocator<std::pair<centroid,_rect>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->locations).c.
  super__Deque_base<std::pair<centroid,_rect>,_std::allocator<std::pair<centroid,_rect>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->locations).c.
  super__Deque_base<std::pair<centroid,_rect>,_std::allocator<std::pair<centroid,_rect>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->locations).c.
  super__Deque_base<std::pair<centroid,_rect>,_std::allocator<std::pair<centroid,_rect>_>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->locations).c.
  super__Deque_base<std::pair<centroid,_rect>,_std::allocator<std::pair<centroid,_rect>_>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<std::pair<centroid,_rect>,_std::allocator<std::pair<centroid,_rect>_>_>::
  _M_initialize_map((_Deque_base<std::pair<centroid,_rect>,_std::allocator<std::pair<centroid,_rect>_>_>
                     *)this,0);
  (this->speeds).c.
  super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->speeds).c.
  super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->speeds).c.
  super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->speeds).c.
  super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->speeds).c.
  super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->speeds).c.
  super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->speeds).c.
  super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->speeds).c.
  super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->speeds).c.
  super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->speeds).c.
  super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::
  _M_initialize_map((_Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                     *)&this->speeds,0);
  (this->accelerations).c.
  super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->accelerations).c.
  super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->accelerations).c.
  super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->accelerations).c.
  super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->accelerations).c.
  super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->accelerations).c.
  super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->accelerations).c.
  super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->accelerations).c.
  super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->accelerations).c.
  super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->accelerations).c.
  super__Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::
  _M_initialize_map((_Deque_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                     *)&this->accelerations,0);
  (this->lastlocation).first = 0.0;
  (this->lastlocation).second = 0.0;
  (this->lastspeed).first = 0.0;
  (this->lastspeed).second = 0.0;
  this->objectID = _objectID;
  this->maxRemenbers = 100;
  local_48.second.x1 = r->x1;
  local_48.second.y1 = r->y1;
  local_48.second.x2 = r->x2;
  local_48.second.y2 = r->y2;
  local_48.first = c;
  std::deque<std::pair<centroid,rect>,std::allocator<std::pair<centroid,rect>>>::
  emplace_back<std::pair<centroid,rect>>
            ((deque<std::pair<centroid,rect>,std::allocator<std::pair<centroid,rect>>> *)this,
             &local_48);
  (this->lastlocation).first = (float)c.x;
  (this->lastlocation).second = (float)c.y;
  return;
}

Assistant:

Trackableobject(int _objectID, centroid c, rect r) {
		this->objectID = _objectID;
		maxRemenbers = 100;
		this->locations.push(std::pair<centroid, rect>(c, r));

		lastlocation = std::pair<float, float>(c.x, c.y);
	}